

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O0

void FDDSTexture::CalcBitShift(DWORD mask,BYTE *lshiftp,BYTE *rshiftp)

{
  undefined1 local_21;
  BYTE shift;
  BYTE *rshiftp_local;
  BYTE *lshiftp_local;
  DWORD mask_local;
  
  if (mask == 0) {
    *rshiftp = '\0';
    *lshiftp = '\0';
  }
  else {
    local_21 = '\0';
    for (lshiftp_local._4_4_ = mask; (lshiftp_local._4_4_ & 0x80000000) == 0;
        lshiftp_local._4_4_ = lshiftp_local._4_4_ << 1) {
      local_21 = local_21 + '\x01';
    }
    *lshiftp = local_21;
    local_21 = '\0';
    for (; (lshiftp_local._4_4_ & 0x80000000) != 0; lshiftp_local._4_4_ = lshiftp_local._4_4_ << 1)
    {
      local_21 = local_21 + '\x01';
    }
    *rshiftp = local_21;
  }
  return;
}

Assistant:

void FDDSTexture::CalcBitShift (DWORD mask, BYTE *lshiftp, BYTE *rshiftp)
{
	BYTE shift;

	if (mask == 0)
	{
		*lshiftp = *rshiftp = 0;
		return;
	}

	shift = 0;
	while ((mask & 0x80000000) == 0)
	{
		mask <<= 1;
		shift++;
	}
	*lshiftp = shift;

	shift = 0;
	while (mask & 0x80000000)
	{
		mask <<= 1;
		shift++;
	}
	*rshiftp = shift;
}